

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion * __thiscall QRegion::operator=(QRegion *this,QRegion *r)

{
  bool bVar1;
  QRegionData *in_RSI;
  QRegion *in_RDI;
  QRegion *this_00;
  
  this_00 = in_RDI;
  QtPrivate::RefCount::ref(&in_RSI->ref);
  bVar1 = QtPrivate::RefCount::deref((RefCount *)this_00);
  if (!bVar1) {
    cleanUp(in_RSI);
  }
  in_RDI->d = *(QRegionData **)in_RSI;
  return in_RDI;
}

Assistant:

QRegion &QRegion::operator=(const QRegion &r)
{
    r.d->ref.ref();
    if (!d->ref.deref())
        cleanUp(d);
    d = r.d;
    return *this;
}